

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O0

c_v128 c_v128_add_64(c_v128 a,c_v128 b)

{
  ulong in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  c_v128 cVar1;
  undefined8 local_48;
  undefined8 local_38;
  
  if ((in_RCX ^ 0xffffffffffffffff) < in_RSI) {
    local_38 = (in_RSI - (in_RCX ^ 0xffffffffffffffff)) - 1;
  }
  else {
    local_38 = in_RSI + in_RCX;
  }
  if ((in_RDX ^ 0xffffffffffffffff) < in_RDI) {
    local_48 = (in_RDI - (in_RDX ^ 0xffffffffffffffff)) - 1;
  }
  else {
    local_48 = in_RDI + in_RDX;
  }
  cVar1 = c_v128_from_64(local_38,local_48);
  return cVar1;
}

Assistant:

SIMD_INLINE c_v128 c_v128_add_64(c_v128 a, c_v128 b) {
  // Two complement overflow (silences sanitizers)
  return c_v128_from_64(
      a.v64[1].u64 > ~b.v64[1].u64 ? a.v64[1].u64 - ~b.v64[1].u64 - 1
                                   : a.v64[1].u64 + b.v64[1].u64,
      a.v64[0].u64 > ~b.v64[0].u64 ? a.v64[0].u64 - ~b.v64[0].u64 - 1
                                   : a.v64[0].u64 + b.v64[0].u64);
}